

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress4X_hufOnly_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize)

{
  U32 UVar1;
  void *in_RCX;
  HUF_DTable *in_RDX;
  size_t in_RDI;
  size_t in_R8;
  void *in_R9;
  U32 algoNb;
  void *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  if (in_RDX == (HUF_DTable *)0x0) {
    local_8 = 0xfffffffffffffffe;
  }
  else if (in_R8 == 0) {
    local_8 = 0xfffffffffffffffc;
  }
  else {
    UVar1 = HUF_selectDecoder((size_t)in_RDX,in_R8);
    if (UVar1 == 0) {
      local_8 = HUF_decompress4X1_DCtx_wksp
                          (in_RDX,in_RCX,in_R8,in_R9,(ulong)in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8,in_RDI);
    }
    else {
      local_8 = HUF_decompress4X2_DCtx_wksp
                          (in_RDX,in_RCX,in_R8,in_R9,CONCAT44(UVar1,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,in_RDI);
    }
  }
  return local_8;
}

Assistant:

size_t HUF_decompress4X_hufOnly_wksp(HUF_DTable* dctx, void* dst,
                                     size_t dstSize, const void* cSrc,
                                     size_t cSrcSize, void* workSpace,
                                     size_t wkspSize)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize == 0) return ERROR(corruption_detected);

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
        return algoNb ? HUF_decompress4X2_DCtx_wksp(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize):
                        HUF_decompress4X1_DCtx_wksp(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize);
    }
}